

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O1

void gravity_lexer_skip_line(gravity_lexer_t *lexer)

{
  int c;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)lexer->offset;
  if (lexer->offset < lexer->length) {
    do {
      uStack_18 = uStack_18 & 0xffffffff;
      next_utf8(lexer,(int *)((long)&uStack_18 + 4));
      if (uStack_18._4_4_ == 10) {
LAB_001163ea:
        lexer->lineno = lexer->lineno + 1;
        lexer->colno = 1;
        return;
      }
      if (uStack_18._4_4_ == 0xd) {
        if (lexer->buffer[lexer->offset] == '\n') {
          lexer->offset = lexer->offset + 1;
          lexer->position = lexer->position + 1;
          lexer->colno = lexer->colno + 1;
        }
        goto LAB_001163ea;
      }
    } while (lexer->offset < lexer->length);
  }
  return;
}

Assistant:

void gravity_lexer_skip_line (gravity_lexer_t *lexer) {
    while (!IS_EOF) {
        int c = 0;
        next_utf8(lexer, &c);
        if (is_newline(lexer, c)) {
            INC_LINE;
            break;
        }
    }
}